

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

void X86_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  cs_detail *pcVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  int i;
  uint id_local;
  cs_insn *insn_local;
  cs_struct *h_local;
  
  uVar2 = insn_find(insns,0x1735,id,&h->insn_cache);
  uVar3 = (uint)uVar2;
  if ((uVar3 != 0) && (insn->id = (uint)insns[(int)uVar3].mapid, h->detail != CS_OPT_OFF)) {
    pcVar1 = insn->detail;
    *(undefined4 *)(pcVar1->regs_read + 8) = *(undefined4 *)(insns[(int)uVar3].regs_use + 8);
    *(undefined8 *)pcVar1->regs_read = *(undefined8 *)insns[(int)uVar3].regs_use;
    uVar4 = count_positive(insns[(int)uVar3].regs_use);
    insn->detail->regs_read_count = (uint8_t)uVar4;
    if (id == 0x935) {
      if (h->mode == CS_MODE_64) {
        pcVar1 = insn->detail;
        *(undefined8 *)pcVar1->regs_write = *(undefined8 *)insns[(int)uVar3].regs_mod;
        *(undefined8 *)(pcVar1->regs_write + 8) = *(undefined8 *)(insns[(int)uVar3].regs_mod + 8);
        *(undefined4 *)(pcVar1->regs_write + 0x10) =
             *(undefined4 *)(insns[(int)uVar3].regs_mod + 0x10);
        uVar4 = count_positive(insns[(int)uVar3].regs_mod);
        insn->detail->regs_write_count = (uint8_t)uVar4;
      }
      else {
        insn->detail->regs_write[0] = '\x13';
        insn->detail->regs_write[1] = '\x18';
        insn->detail->regs_write_count = '\x02';
      }
    }
    else if (id == 0x936) {
      if (h->mode == CS_MODE_64) {
        pcVar1 = insn->detail;
        *(undefined8 *)pcVar1->regs_write = *(undefined8 *)insns[(int)uVar3].regs_mod;
        *(undefined8 *)(pcVar1->regs_write + 8) = *(undefined8 *)(insns[(int)uVar3].regs_mod + 8);
        *(undefined4 *)(pcVar1->regs_write + 0x10) =
             *(undefined4 *)(insns[(int)uVar3].regs_mod + 0x10);
        uVar4 = count_positive(insns[(int)uVar3].regs_mod);
        insn->detail->regs_write_count = (uint8_t)uVar4;
      }
      else {
        insn->detail->regs_write[0] = '\x13';
        insn->detail->regs_write[1] = '\x16';
        insn->detail->regs_write[2] = '\x18';
        insn->detail->regs_write_count = '\x03';
      }
    }
    else {
      pcVar1 = insn->detail;
      *(undefined8 *)pcVar1->regs_write = *(undefined8 *)insns[(int)uVar3].regs_mod;
      *(undefined8 *)(pcVar1->regs_write + 8) = *(undefined8 *)(insns[(int)uVar3].regs_mod + 8);
      *(undefined4 *)(pcVar1->regs_write + 0x10) =
           *(undefined4 *)(insns[(int)uVar3].regs_mod + 0x10);
      uVar4 = count_positive(insns[(int)uVar3].regs_mod);
      insn->detail->regs_write_count = (uint8_t)uVar4;
    }
    *(undefined8 *)insn->detail->groups = *(undefined8 *)insns[(int)uVar3].groups;
    uVar4 = count_positive(insns[(int)uVar3].groups);
    insn->detail->groups_count = (uint8_t)uVar4;
    if (((insns[(int)uVar3].branch & 1U) != 0) || ((insns[(int)uVar3].indirect_branch & 1U) != 0)) {
      insn->detail->groups[insn->detail->groups_count] = '\x01';
      insn->detail->groups_count = insn->detail->groups_count + '\x01';
    }
    uVar2 = insns[(int)uVar3].id;
    if ((((uVar2 == 0x766) || (uVar2 == 0x768)) || (uVar2 == 0x76a)) &&
       (*(long *)((long)&insn->detail->field_6 + 0x38) == -0x4e)) {
      insn->detail->groups[insn->detail->groups_count] = '\x04';
      insn->detail->groups_count = insn->detail->groups_count + '\x01';
    }
  }
  return;
}

Assistant:

void X86_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			// special cases when regs_write[] depends on arch
			switch(id) {
				default:
					memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
					insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					break;
				case X86_RDTSC:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_EDX;
						insn->detail->regs_write_count = 2;
					}
					break;
				case X86_RDTSCP:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_ECX;
						insn->detail->regs_write[2] = X86_REG_EDX;
						insn->detail->regs_write_count = 3;
					}
					break;
			}

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = X86_GRP_JUMP;
				insn->detail->groups_count++;
			}

			switch (insns[i].id) {
				case X86_OUT8ir:
				case X86_OUT16ir:
				case X86_OUT32ir:
					if (insn->detail->x86.operands[0].imm == -78) {
						// Writing to port 0xb2 causes an SMI on most platforms
						// See: http://cs.gmu.edu/~tr-admin/papers/GMU-CS-TR-2011-8.pdf
						insn->detail->groups[insn->detail->groups_count] = X86_GRP_INT;
						insn->detail->groups_count++;
					}
					break;

				default:
					break;
			}
#endif
		}
	}
}